

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::generateSyntheticAnnotation
          (TraverseSchema *this,DOMElement *elem,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *pVVar4;
  DOMNode **ppDVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar6;
  undefined4 extraout_var_03;
  DOMElement *pDVar7;
  undefined4 extraout_var_04;
  XSAnnotation *this_00;
  XMLFileLoc line;
  XMLFileLoc col;
  undefined1 *p;
  XMLBuffer *this_01;
  XSAnnotation *annot;
  XMLCh *local_88;
  XMLCh *attName;
  DOMNode *attribute;
  XMLSize_t j;
  XMLSize_t attrCount;
  DOMNamedNodeMap *eltAttrs;
  DOMElement *currentElem;
  DOMNode *attNode;
  XMLSize_t i;
  XMLSize_t nonXSAttSize;
  bool sawXMLNS;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *local_30;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *listOfURIs;
  XMLCh *prefix;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  prefix = (XMLCh *)nonXSAttList;
  nonXSAttList_local = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)elem;
  elem_local = (DOMElement *)this;
  iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0x17])();
  listOfURIs = (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)
               CONCAT44(extraout_var,iVar2);
  pVVar4 = (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,this->fMemoryManager);
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::ValueHashTableOf
            (pVVar4,0x1d,this->fMemoryManager);
  nonXSAttSize._3_1_ = 0;
  local_30 = pVVar4;
  XMLBuffer::reset(&this->fBuffer);
  XMLBuffer::append(&this->fBuffer,L'<');
  if (listOfURIs != (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)0x0) {
    XMLBuffer::append(&this->fBuffer,(XMLCh *)listOfURIs);
    XMLBuffer::append(&this->fBuffer,L':');
  }
  p = SchemaSymbols::fgELT_ANNOTATION;
  XMLBuffer::append(&this->fBuffer,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
  i = ValueVectorOf<xercesc_4_0::DOMNode_*>::size((ValueVectorOf<xercesc_4_0::DOMNode_*> *)prefix);
  for (attNode = (DOMNode *)0x0; attNode < i;
      attNode = (DOMNode *)((long)&attNode->_vptr_DOMNode + 1)) {
    ppDVar5 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt
                        ((ValueVectorOf<xercesc_4_0::DOMNode_*> *)prefix,(XMLSize_t)attNode);
    currentElem = (DOMElement *)*ppDVar5;
    XMLBuffer::append(&this->fBuffer,L' ');
    iVar2 = (*(currentElem->super_DOMNode)._vptr_DOMNode[2])();
    XMLBuffer::append(&this->fBuffer,(XMLCh *)CONCAT44(extraout_var_00,iVar2));
    XMLBuffer::append(&this->fBuffer,L'=');
    XMLBuffer::append(&this->fBuffer,L'\"');
    iVar2 = (*(currentElem->super_DOMNode)._vptr_DOMNode[3])();
    processAttValue(this,(XMLCh *)CONCAT44(extraout_var_01,iVar2),&this->fBuffer);
    p = (undefined1 *)0x22;
    XMLBuffer::append(&this->fBuffer,L'\"');
  }
  eltAttrs = (DOMNamedNodeMap *)nonXSAttList_local;
  do {
    iVar2 = (*eltAttrs->_vptr_DOMNamedNodeMap[0xb])();
    attrCount = CONCAT44(extraout_var_02,iVar2);
    j = (**(code **)(*(long *)attrCount + 0x28))();
    for (attribute = (DOMNode *)0x0; attribute < j;
        attribute = (DOMNode *)((long)&attribute->_vptr_DOMNode + 1)) {
      attName = (XMLCh *)(**(code **)(*(long *)attrCount + 0x18))(attrCount,attribute);
      local_88 = (XMLCh *)(**(code **)(*(long *)attName + 0x10))();
      p = XMLUni::fgXMLNSColonString;
      bVar1 = XMLString::startsWith(local_88,(XMLCh *)XMLUni::fgXMLNSColonString);
      if (bVar1) {
        p = (undefined1 *)local_88;
        bVar1 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                          (local_30,local_88);
        if (!bVar1) {
          annot._4_4_ = 0;
          ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put
                    (local_30,local_88,(uint *)((long)&annot + 4));
          XMLBuffer::append(&this->fBuffer,L' ');
          XMLBuffer::append(&this->fBuffer,local_88);
          XMLBuffer::append(&this->fBuffer,L'=');
          XMLBuffer::append(&this->fBuffer,L'\"');
          pXVar6 = (XMLCh *)(**(code **)(*(long *)attName + 0x18))();
          processAttValue(this,pXVar6,&this->fBuffer);
          p = (undefined1 *)0x22;
          XMLBuffer::append(&this->fBuffer,L'\"');
        }
      }
      else if ((nonXSAttSize._3_1_ & 1) == 0) {
        p = XMLUni::fgXMLNSString;
        bVar1 = XMLString::equals(local_88,(XMLCh *)XMLUni::fgXMLNSString);
        if (bVar1) {
          XMLBuffer::append(&this->fBuffer,L' ');
          XMLBuffer::append(&this->fBuffer,local_88);
          XMLBuffer::append(&this->fBuffer,L'=');
          XMLBuffer::append(&this->fBuffer,L'\"');
          pXVar6 = (XMLCh *)(**(code **)(*(long *)attName + 0x18))();
          processAttValue(this,pXVar6,&this->fBuffer);
          p = (undefined1 *)0x22;
          XMLBuffer::append(&this->fBuffer,L'\"');
          nonXSAttSize._3_1_ = 1;
        }
      }
    }
    iVar2 = (*eltAttrs->_vptr_DOMNamedNodeMap[5])();
    eltAttrs = (DOMNamedNodeMap *)CONCAT44(extraout_var_03,iVar2);
    pDVar7 = SchemaInfo::getRoot(this->fSchemaInfo);
    iVar3 = (*(pDVar7->super_DOMNode)._vptr_DOMNode[5])();
    pVVar4 = local_30;
  } while ((DOMNamedNodeMap *)CONCAT44(extraout_var_03,iVar2) !=
           (DOMNamedNodeMap *)CONCAT44(extraout_var_04,iVar3));
  if (local_30 != (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)0x0) {
    ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf(local_30);
    XMemory::operator_delete((XMemory *)pVVar4,p);
  }
  XMLBuffer::append(&this->fBuffer,L'>');
  XMLBuffer::append(&this->fBuffer,L'\n');
  XMLBuffer::append(&this->fBuffer,L'<');
  if (listOfURIs != (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)0x0) {
    XMLBuffer::append(&this->fBuffer,(XMLCh *)listOfURIs);
    XMLBuffer::append(&this->fBuffer,L':');
  }
  XMLBuffer::append(&this->fBuffer,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
  XMLBuffer::append(&this->fBuffer,L'>');
  XMLBuffer::append(&this->fBuffer,(XMLCh *)fgSynthetic_Annotation);
  XMLBuffer::append(&this->fBuffer,L'<');
  XMLBuffer::append(&this->fBuffer,L'/');
  if (listOfURIs != (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)0x0) {
    XMLBuffer::append(&this->fBuffer,(XMLCh *)listOfURIs);
    XMLBuffer::append(&this->fBuffer,L':');
  }
  XMLBuffer::append(&this->fBuffer,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
  XMLBuffer::append(&this->fBuffer,L'>');
  XMLBuffer::append(&this->fBuffer,L'\n');
  XMLBuffer::append(&this->fBuffer,L'<');
  XMLBuffer::append(&this->fBuffer,L'/');
  if (listOfURIs != (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)0x0) {
    XMLBuffer::append(&this->fBuffer,(XMLCh *)listOfURIs);
    XMLBuffer::append(&this->fBuffer,L':');
  }
  this_01 = &this->fBuffer;
  XMLBuffer::append(this_01,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
  XMLBuffer::append(this_01,L'>');
  this_00 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
  pXVar6 = XMLBuffer::getRawBuffer(this_01);
  XSAnnotation::XSAnnotation(this_00,pXVar6,this->fGrammarPoolMemoryManager);
  line = XSDElementNSImpl::getLineNo((XSDElementNSImpl *)nonXSAttList_local);
  col = XSDElementNSImpl::getColumnNo((XSDElementNSImpl *)nonXSAttList_local);
  XSAnnotation::setLineCol(this_00,line,col);
  pXVar6 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
  XSAnnotation::setSystemId(this_00,pXVar6);
  return this_00;
}

Assistant:

XSAnnotation* TraverseSchema::generateSyntheticAnnotation(const DOMElement* const elem
                                             , ValueVectorOf<DOMNode*>* nonXSAttList)
{
    const XMLCh* prefix = elem->getPrefix();
    ValueHashTableOf<unsigned int>* listOfURIs = new (fMemoryManager) ValueHashTableOf<unsigned int>(29, fMemoryManager);
    bool sawXMLNS = false;

    fBuffer.reset();
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);

    // next is the nonXSAttList names & values
    XMLSize_t nonXSAttSize = nonXSAttList->size();

    for (XMLSize_t i=0; i<nonXSAttSize; i++)
    {
        DOMNode* attNode = nonXSAttList->elementAt(i);

        fBuffer.append(chSpace);
        fBuffer.append(attNode->getNodeName());
        fBuffer.append(chEqual);
        fBuffer.append(chDoubleQuote);
        processAttValue(attNode->getNodeValue(), fBuffer);
        fBuffer.append(chDoubleQuote);
    }

    // next is the namespaces on the elem
    DOMElement* currentElem = (DOMElement*) elem;
    DOMNamedNodeMap* eltAttrs;
    XMLSize_t     attrCount;
    do {
        eltAttrs = currentElem->getAttributes();
        attrCount = eltAttrs->getLength();
        for (XMLSize_t j = 0; j < attrCount; j++)
        {
            DOMNode*     attribute = eltAttrs->item(j);
            const XMLCh* attName = attribute->getNodeName();

            if (XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            {
                if (!listOfURIs->containsKey((void*) attName)) {
                    listOfURIs->put((void*) attName, 0);
                    fBuffer.append(chSpace);
                    fBuffer.append(attName);
                    fBuffer.append(chEqual);
                    fBuffer.append(chDoubleQuote);
                    processAttValue(attribute->getNodeValue(), fBuffer);
                    fBuffer.append(chDoubleQuote);
                }
            }
            else if (!sawXMLNS && XMLString::equals(attName, XMLUni::fgXMLNSString))
            {
                fBuffer.append(chSpace);
                fBuffer.append(attName);
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attribute->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
                sawXMLNS = true;
            }
        }
        currentElem = (DOMElement*) currentElem->getParentNode();
    }
    while (currentElem != fSchemaInfo->getRoot()->getParentNode());
    delete listOfURIs;

    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(fgSynthetic_Annotation);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);
    fBuffer.append(chCloseAngle);

    XSAnnotation* annot = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
    annot->setLineCol( ((XSDElementNSImpl*)elem)->getLineNo()
                     , ((XSDElementNSImpl*)elem)->getColumnNo() );
    annot->setSystemId(fSchemaInfo->getCurrentSchemaURL());
    return annot;
}